

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O2

void print_bittiming(calc_data *data)

{
  _Bool _Var1;
  uint uVar2;
  can_bittiming_const *pcVar3;
  alg *paVar4;
  can_bittiming *pcVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  uint *puVar15;
  calc_ref_clk *pcVar16;
  bool bVar17;
  net_device dev;
  can_bittiming local_78;
  double local_50;
  calc_ref_clk *local_48;
  _func_void_can_bittiming_ptr__Bool *local_40;
  ulong local_38;
  
  pcVar16 = data->ref_clks;
  if ((pcVar16->clk == 0) && (data->quiet == false)) {
    printf("Skipping bit timing parameter calculation for %s, no ref clock defined\n\n",
           data->bittiming_const);
  }
  do {
    if (pcVar16->clk == 0) {
      return;
    }
    local_40 = data->printf_btr;
    puVar15 = data->bitrates;
    bVar6 = data->quiet;
    _Var1 = data->verbose;
    local_48 = pcVar16;
    if (local_40 == (_func_void_can_bittiming_ptr__Bool *)0x0) {
      local_40 = printf_btr_nop;
    }
    for (; uVar2 = *puVar15, uVar2 != 0; puVar15 = puVar15 + 1) {
      uVar14 = 0x36b;
      if (500000 < uVar2) {
        uVar14 = 800;
      }
      if (800000 < uVar2) {
        uVar14 = 0x2ee;
      }
      if (data->sample_point != 0) {
        uVar14 = data->sample_point;
      }
      pcVar3 = data->bittiming_const;
      paVar4 = data->alg;
      pcVar5 = data->opt_bt;
      dev.priv.clock.freq = (can_priv)local_48->clk;
      local_78.sjw = 0;
      local_78.brp = 0;
      local_78.tq = 0;
      local_78.prop_seg = 0;
      local_78.phase_seg1 = 0;
      local_78.phase_seg2 = 0;
      local_78.sample_point = uVar14;
      local_78.bitrate = uVar2;
      if ((bVar6 & 1) == 0) {
        pcVar11 = "";
        if (data->fd_mode != false) {
          pcVar11 = "Data ";
        }
        pcVar12 = local_48->name;
        bVar17 = pcVar12 == (char *)0x0;
        pcVar10 = "(";
        if (bVar17) {
          pcVar10 = "";
          pcVar12 = "";
        }
        pcVar13 = ") ";
        if (bVar17) {
          pcVar13 = "";
        }
        printf("%sBit timing parameters for %s with %.6f MHz ref clock %s%s%susing algo \'%s\'\n",
               (double)(uint)dev.priv.clock.freq / 1000000.0,pcVar11,pcVar3,pcVar10,pcVar12,pcVar13,
               paVar4->name);
        pcVar11 = " nominal                                  real  Bitrt    nom   real   SampP";
        if (_Var1 != false) {
          local_50 = (double)(ulong)pcVar3->sjw_max;
          local_38 = (ulong)pcVar3->brp_min;
          printf(anon_var_dwarf_762,(ulong)pcVar3->tseg1_min,(ulong)pcVar3->tseg1_max,
                 (ulong)pcVar3->tseg2_min,(ulong)pcVar3->tseg2_max,1,local_50,local_38,
                 (ulong)pcVar3->brp_max,(ulong)pcVar3->brp_inc);
          pcVar11 = " nominal          |    |    |   |   |     real  Bitrt    nom   real   SampP";
        }
        puts(pcVar11);
        printf(" Bitrate TQ[ns] PrS PhS1 PhS2 SJW BRP  Bitrate  Error  SampP  SampP   Error  ");
        (*local_40)(&local_78,true);
        putchar(10);
      }
      if (pcVar5 == (can_bittiming *)0x0) {
        iVar7 = (*(paVar4->field_0).calc_bittiming)(&dev,&local_78,pcVar3);
        if (iVar7 == 0) goto LAB_001045fd;
        pcVar11 = "%8d ***bitrate not possible***\n";
LAB_001045e9:
        printf(pcVar11,(ulong)uVar2);
      }
      else {
        local_78.bitrate = pcVar5->bitrate;
        local_78.sample_point = pcVar5->sample_point;
        local_78.tq = pcVar5->tq;
        local_78.prop_seg = pcVar5->prop_seg;
        local_78.phase_seg1 = pcVar5->phase_seg1;
        local_78.phase_seg2 = pcVar5->phase_seg2;
        local_78.sjw = pcVar5->sjw;
        local_78.brp = pcVar5->brp;
        iVar7 = (*(paVar4->field_1).fixup_bittiming)(&dev,&local_78,pcVar3);
        if (iVar7 != 0) {
          pcVar11 = "%8d ***parameters exceed controller\'s range***\n";
          goto LAB_001045e9;
        }
LAB_001045fd:
        iVar8 = uVar2 - local_78.bitrate;
        iVar7 = -iVar8;
        if (0 < iVar8) {
          iVar7 = iVar8;
        }
        iVar9 = uVar14 - local_78.sample_point;
        iVar8 = -iVar9;
        if (0 < iVar9) {
          iVar8 = iVar9;
        }
        printf("%8d %6d %3d %4d %4d %3d %3d %8d  ",(ulong)uVar2,local_78._8_8_ & 0xffffffff,
               (ulong)local_78._8_8_ >> 0x20,local_78._16_8_ & 0xffffffff,
               (ulong)local_78._16_8_ >> 0x20,local_78._24_8_ & 0xffffffff,
               (ulong)local_78._24_8_ >> 0x20,local_78._0_8_ & 0xffffffff);
        if (((double)iVar7 * 100.0) / (double)uVar2 <= 99.9) {
          printf("%4.1f%%  ");
        }
        else {
          printf(anon_var_dwarf_7e6);
        }
        local_50 = (double)uVar14;
        printf("%4.1f%%  %4.1f%%  ",local_50 / 10.0,(double)((ulong)local_78._0_8_ >> 0x20) / 10.0);
        if (((double)iVar8 * 100.0) / local_50 <= 99.9) {
          printf("%4.1f%%   ");
        }
        else {
          printf(anon_var_dwarf_807);
        }
        (*local_40)(&local_78,false);
        putchar(10);
      }
      bVar6 = 1;
    }
    putchar(10);
    pcVar16 = local_48 + 1;
  } while( true );
}

Assistant:

static void print_bittiming(const struct calc_data *data)
{
	const struct calc_ref_clk *ref_clks = data->ref_clks;

	if (!ref_clks->clk && !data->quiet)
		printf("Skipping bit timing parameter calculation for %s, no ref clock defined\n\n",
		       data->bittiming_const->name);

	while (ref_clks->clk) {
		void (*printf_btr)(struct can_bittiming *bt, bool hdr);
		unsigned int const *bitrates = data->bitrates;
		bool quiet = data->quiet;
		bool verbose = data->verbose;

		if (data->printf_btr)
			printf_btr = data->printf_btr;
		else
			printf_btr = printf_btr_nop;

		while (*bitrates) {
			unsigned int sample_point;

			/* get nominal sample point */
			if (data->sample_point)
				sample_point = data->sample_point;
			else
				sample_point = get_cia_sample_point(*bitrates);

			print_bittiming_one(data->alg,
					    data->bittiming_const,
					    data->opt_bt,
					    ref_clks,
					    *bitrates,
					    sample_point,
					    printf_btr,
					    quiet,
					    verbose,
					    data->fd_mode);
			bitrates++;
			quiet = true;
		}

		printf("\n");
		ref_clks++;
	}
}